

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall ADPlanner::UpdateSetMembership(ADPlanner *this,ADState *state)

{
  long *in_RSI;
  long *in_RDI;
  CKey key;
  CKey local_68;
  long in_stack_ffffffffffffffb0;
  int listindex;
  AbstractSearchState *in_stack_ffffffffffffffb8;
  CHeap *in_stack_ffffffffffffffc0;
  CKey *in_stack_ffffffffffffffd0;
  AbstractSearchState *in_stack_ffffffffffffffd8;
  CHeap *in_stack_ffffffffffffffe0;
  
  listindex = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  CKey::CKey((CKey *)&stack0xffffffffffffffe0);
  if ((int)in_RSI[4] == *(int *)((long)in_RSI + 0x24)) {
    if ((int)in_RSI[2] == 0) {
      if (*in_RSI != 0) {
        CList::remove(*(CList **)(in_RDI[0xf] + 0x18),(char *)in_RSI);
      }
    }
    else {
      CHeap::deleteheap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  else if ((short)in_RSI[5] == *(short *)(in_RDI[0xf] + 0x20)) {
    if (*in_RSI == 0) {
      CList::insert((CList *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,listindex);
    }
  }
  else {
    (**(code **)(*in_RDI + 0x1b0))(&stack0xffffffffffffffd0,in_RDI,in_RSI);
    CKey::operator=((CKey *)&stack0xffffffffffffffe0,(CKey *)&stack0xffffffffffffffd0);
    CKey::~CKey((CKey *)&stack0xffffffffffffffd0);
    if ((int)in_RSI[2] == 0) {
      if (*in_RSI != 0) {
        CList::remove(*(CList **)(in_RDI[0xf] + 0x18),(char *)in_RSI);
      }
      CHeap::insertheap((CHeap *)this,(AbstractSearchState *)state,(CKey *)key.key[1]);
      CKey::~CKey((CKey *)&stack0xffffffffffffffa8);
    }
    else {
      CHeap::updateheap(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd0);
      CKey::~CKey(&local_68);
    }
  }
  CKey::~CKey((CKey *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void ADPlanner::UpdateSetMembership(ADState* state)
{
    CKey key;

    if (state->v != state->g) {
        if (state->iterationclosed != pSearchStateSpace_->searchiteration) {
            key = ComputeKey(state);
            if (state->heapindex == 0) {
                //need to remove it because it can happen when updating edge costs and state is in incons
                if (state->listelem[AD_INCONS_LIST_ID] != NULL) {
                    pSearchStateSpace_->inconslist->remove(state, AD_INCONS_LIST_ID);
                }

                pSearchStateSpace_->heap->insertheap(state, key);

            }
            else
                pSearchStateSpace_->heap->updateheap(state, key);
        }
        else if (state->listelem[AD_INCONS_LIST_ID] == NULL) {
            pSearchStateSpace_->inconslist->insert(state, AD_INCONS_LIST_ID);
        }
    }
    else {
        if (state->heapindex != 0)
            pSearchStateSpace_->heap->deleteheap(state);
        else if (state->listelem[AD_INCONS_LIST_ID] != NULL) {
            pSearchStateSpace_->inconslist->remove(state, AD_INCONS_LIST_ID);
        }
    }
}